

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

void __thiscall
kj::anon_unknown_9::DiskAppendableFile::~DiskAppendableFile(DiskAppendableFile *this)

{
  FdOutputStream::~FdOutputStream(&this->super_FdOutputStream);
  OwnFd::~OwnFd(&(this->super_DiskHandle).fd);
  ArrayOutputStream::~ArrayOutputStream
            ((ArrayOutputStream *)&(this->super_AppendableFile).super_OutputStream);
  operator_delete(this,0x28);
  return;
}

Assistant:

DiskAppendableFile(OwnFd&& fd)
      : DiskHandle(kj::mv(fd)),
        FdOutputStream(DiskHandle::fd.get()) {}